

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O0

void __thiscall absl::lts_20250127::substitute_internal::Arg::Arg(Arg *this,Hex hex)

{
  char *pcVar1;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  char *local_40;
  char *beg;
  uint64_t value;
  char *writer;
  char *end;
  Arg *this_local;
  Hex hex_local;
  
  hex_local.value = hex._8_8_;
  this_local = (Arg *)hex.value;
  end = (char *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->piece_);
  writer = (char *)(this + 1);
  beg = (char *)this_local;
  value = (uint64_t)writer;
  do {
    pcVar1 = (char *)(value - 1);
    *(char *)(value - 1) = "0123456789abcdef"[(ulong)beg & 0xf];
    beg = (char *)((ulong)beg >> 4);
    value = (uint64_t)pcVar1;
  } while (beg != (char *)0x0);
  local_40 = pcVar1;
  if ((long)writer - (long)pcVar1 < (long)(hex_local.value & 0xff)) {
    local_40 = (char *)((long)writer - (long)(int)(uint)(byte)hex_local.value);
    std::fill_n<char*,long,char>
              (local_40,(long)pcVar1 - (long)local_40,(char *)((long)&hex_local.value + 1));
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,local_40,(long)writer - (long)local_40);
  (this->piece_)._M_len = local_50._M_len;
  (this->piece_)._M_str = local_50._M_str;
  return;
}

Assistant:

Arg::Arg(Hex hex) {
  char* const end = &scratch_[numbers_internal::kFastToBufferSize];
  char* writer = end;
  uint64_t value = hex.value;
  do {
    *--writer = absl::numbers_internal::kHexChar[value & 0xF];
    value >>= 4;
  } while (value != 0);

  char* beg;
  if (end - writer < hex.width) {
    beg = end - hex.width;
    std::fill_n(beg, writer - beg, hex.fill);
  } else {
    beg = writer;
  }

  piece_ = absl::string_view(beg, static_cast<size_t>(end - beg));
}